

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

indirect_string * __thiscall
pstore::serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>
          (indirect_string *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  type uninit_buffer;
  value_type local_30;
  
  flood<pstore::serialize::details::aligned_storage<24ul,8ul>::type>((type *)&local_30);
  serializer<pstore::indirect_string,void>::
  read_string_address<pstore::serialize::archive::database_reader&>
            ((database_reader *)this,&local_30);
  __return_storage_ptr__->field_2 = local_30.field_2;
  __return_storage_ptr__->db_ = local_30.db_;
  __return_storage_ptr__->is_pointer_ = local_30.is_pointer_;
  *(undefined7 *)&__return_storage_ptr__->field_0x9 = local_30._9_7_;
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }